

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsPreviewWidget.cpp
# Opt level: O1

void __thiscall KDReports::PreviewWidgetPrivate::fillZoomCombo(PreviewWidgetPrivate *this)

{
  double dVar1;
  QComboBox *pQVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  QString t;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  undefined1 local_58 [40];
  
  QComboBox::clear();
  bVar4 = false;
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)fillZoomCombo::s_zoomFactors + lVar5);
    if ((!bVar4) && (this->m_zoomFactor <= dVar1 + -0.001)) {
      pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
      QString::number(this->m_zoomFactor * 100.0,(char)&local_88,0x67);
      local_70.d = local_88.d;
      local_70.ptr = local_88.ptr;
      local_70.size = local_88.size;
      if (local_88.d != (Data *)0x0) {
        LOCK();
        ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QChar)(char16_t)&local_70);
      QVariant::QVariant((QVariant *)(local_58 + 8),dVar1);
      uVar3 = QComboBox::count();
      QIcon::QIcon((QIcon *)local_58);
      QComboBox::insertItem
                ((int)pQVar2,(QIcon *)(ulong)uVar3,(QString *)local_58,(QVariant *)&local_70);
      QIcon::~QIcon((QIcon *)local_58);
      QVariant::~QVariant((QVariant *)(local_58 + 8));
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
      QComboBox::count();
      QComboBox::setCurrentIndex((int)pQVar2);
      bVar4 = true;
    }
    pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
    QString::number(dVar1 * 100.0,(char)&local_88,0x67);
    local_70.d = local_88.d;
    local_70.ptr = local_88.ptr;
    local_70.size = local_88.size;
    if (local_88.d != (Data *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QChar)(char16_t)&local_70);
    QVariant::QVariant((QVariant *)(local_58 + 8),dVar1);
    uVar3 = QComboBox::count();
    QIcon::QIcon((QIcon *)local_58);
    QComboBox::insertItem
              ((int)pQVar2,(QIcon *)(ulong)uVar3,(QString *)local_58,(QVariant *)&local_70);
    QIcon::~QIcon((QIcon *)local_58);
    QVariant::~QVariant((QVariant *)(local_58 + 8));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    if ((dVar1 + -0.001 < this->m_zoomFactor) && (this->m_zoomFactor < dVar1 + 0.001)) {
      pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
      QComboBox::count();
      QComboBox::setCurrentIndex((int)pQVar2);
      bVar4 = true;
    }
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  return;
}

Assistant:

void KDReports::PreviewWidgetPrivate::fillZoomCombo()
{
    static const double s_zoomFactors[] = {0.125, 0.25, 0.333, 0.5, 0.667, 0.75, 1, 1.25, 1.50, 2, 4};

    zoomCombo->clear();
    bool currentZoomFound = false;
    for (const qreal val : s_zoomFactors) {
        if (!currentZoomFound && m_zoomFactor <= val - 0.001) {
            zoomCombo->addItem(QString::number(m_zoomFactor * 100) + QChar::fromLatin1('%'), QVariant(val));
            zoomCombo->setCurrentIndex(zoomCombo->count() - 1);
            currentZoomFound = true;
        }
        zoomCombo->addItem(QString::number(val * 100) + QChar::fromLatin1('%'), QVariant(val));
        if (m_zoomFactor > val - 0.001 && m_zoomFactor < val + 0.001) {
            zoomCombo->setCurrentIndex(zoomCombo->count() - 1);
            currentZoomFound = true;
        }
    }
}